

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

void __thiscall CP::list<int>::shift_left(list<int> *this)

{
  list<int> *this_local;
  
  this->mHeader->prev->next = this->mHeader->next;
  this->mHeader->next->prev = this->mHeader->prev;
  this->mHeader->prev = this->mHeader->next;
  this->mHeader->next = this->mHeader->next->next;
  this->mHeader->prev->next = this->mHeader;
  this->mHeader->next->prev = this->mHeader;
  return;
}

Assistant:

void CP::list<T>::shift_left() {
    mHeader->prev->next = mHeader->next;
    mHeader->next->prev = mHeader->prev;
    mHeader->prev = mHeader->next;
    mHeader->next = mHeader->next->next;
    mHeader->prev->next = mHeader;
    mHeader->next->prev = mHeader;
}